

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O1

void __thiscall PenguinV_Image::ImageTemplate<signed_char>::clear(ImageTemplate<signed_char> *this)

{
  char *pcVar1;
  FunctionFacade *this_00;
  _func_void_char_ptr *p_Var2;
  
  pcVar1 = this->_data;
  if (pcVar1 != (char *)0x0) {
    this_00 = FunctionFacade::instance();
    p_Var2 = __PenguinV_Image__ImageTemplate<signed_char>__FunctionFacade___getFunction<void(*)(signed_char*)>_std__vector<void(*)(signed_char*),std::allocator<void(*)(signed_char*)>>const__unsigned_char_const_
                       (this_00,&this_00->_deallocate,this->_type);
    (*p_Var2)(pcVar1);
    this->_data = (char *)0x0;
  }
  this->_width = 0;
  this->_height = 0;
  this->_rowSize = 0;
  return;
}

Assistant:

void clear()
        {
            if( _data != nullptr ) {
                _deallocate( _data );
                _data = nullptr;
            }

            _width   = 0;
            _height  = 0;
            _rowSize = 0;
        }